

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForMessage
          (Context *this,Descriptor *message)

{
  int iVar1;
  int iVar2;
  Descriptor *message_00;
  string *psVar3;
  mapped_type *this_00;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  OneofGeneratorInfo info;
  OneofDescriptor *oneof;
  FieldDescriptor *pFStack_58;
  int i_2;
  int local_3c;
  undefined1 local_38 [4];
  int i_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Descriptor *message_local;
  Context *this_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar2 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    iVar1 = Descriptor::nested_type_count(message);
    if (iVar1 <= iVar2) break;
    message_00 = Descriptor::nested_type
                           (message,fields.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    InitializeFieldGeneratorInfoForMessage(this,message_00);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_38);
  local_3c = 0;
  while( true ) {
    iVar2 = local_3c;
    iVar1 = Descriptor::field_count(message);
    if (iVar1 <= iVar2) break;
    pFStack_58 = Descriptor::field(message,local_3c);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_38,&stack0xffffffffffffffa8);
    local_3c = local_3c + 1;
  }
  InitializeFieldGeneratorInfoForFields
            (this,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_38);
  oneof._4_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::oneof_decl_count(message);
    if (iVar2 <= oneof._4_4_) break;
    info.capitalized_name.field_2._8_8_ = Descriptor::oneof_decl(message,oneof._4_4_);
    OneofGeneratorInfo::OneofGeneratorInfo((OneofGeneratorInfo *)local_a8);
    psVar3 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)info.capitalized_name.field_2._8_8_);
    UnderscoresToCamelCase(&local_c8,psVar3,false);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    psVar3 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)info.capitalized_name.field_2._8_8_);
    UnderscoresToCamelCase(&local_e8,psVar3,true);
    std::__cxx11::string::operator=
              ((string *)(info.name.field_2._M_local_buf + 8),(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    this_00 = std::
              map<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
              ::operator[](&this->oneof_generator_info_map_,
                           (key_type *)((long)&info.capitalized_name.field_2 + 8));
    OneofGeneratorInfo::operator=(this_00,(OneofGeneratorInfo *)local_a8);
    OneofGeneratorInfo::~OneofGeneratorInfo((OneofGeneratorInfo *)local_a8);
    oneof._4_4_ = oneof._4_4_ + 1;
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_38);
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForMessage(
    const Descriptor* message) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    InitializeFieldGeneratorInfoForMessage(message->nested_type(i));
  }
  std::vector<const FieldDescriptor*> fields;
  for (int i = 0; i < message->field_count(); ++i) {
    fields.push_back(message->field(i));
  }
  InitializeFieldGeneratorInfoForFields(fields);

  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    OneofGeneratorInfo info;
    info.name = UnderscoresToCamelCase(oneof->name(), false);
    info.capitalized_name = UnderscoresToCamelCase(oneof->name(), true);
    oneof_generator_info_map_[oneof] = info;
  }
}